

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O2

int ARKStepSetExplicit(void *arkode_mem)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = arkStep_AccessARKODEStepMem(arkode_mem,"ARKStepSetExplicit",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    if (step_mem->fe == (ARKRhsFn)0x0) {
      iVar1 = -0x16;
      arkProcessError(ark_mem,-0x16,0x34,"ARKStepSetExplicit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                      ,
                      "Cannot specify that method is explicit without providing a function pointer to fe(t,y)."
                     );
    }
    else {
      step_mem->explicit = 1;
      step_mem->implicit = 0;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKStepSetExplicit(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* ensure that fe is defined */
  if (step_mem->fe == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_MISSING_FE);
    return (ARK_ILL_INPUT);
  }

  /* set the relevant parameters */
  step_mem->explicit = SUNTRUE;
  step_mem->implicit = SUNFALSE;

  return (ARK_SUCCESS);
}